

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instantiate_template_headers.hpp
# Opt level: O1

int add_tree(IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,double *numeric_data,
            size_t ncols_numeric,int *categ_data,size_t ncols_categ,int *ncat,double *Xc,int *Xc_ind
            ,int *Xc_indptr,size_t ndim,size_t ntry,CoefType coef_type,bool coef_by_prop,
            double *sample_weights,size_t nrows,size_t max_depth,size_t ncols_per_tree,
            bool limit_depth,bool penalize_range,bool standardize_data,bool fast_bratio,
            double *col_weights,bool weigh_by_kurt,double prob_pick_by_gain_pl,
            double prob_pick_by_gain_avg,double prob_pick_by_full_gain,double prob_pick_by_dens,
            double prob_pick_col_by_range,double prob_pick_col_by_var,double prob_pick_col_by_kurt,
            double min_gain,MissingAction missing_action,CategSplit cat_split_type,
            NewCategAction new_cat_action,UseDepthImp depth_imp,WeighImpRows weigh_imp_rows,
            bool all_perm,Imputer *imputer,size_t min_imp_obs,TreesIndexer *indexer,
            double *ref_numeric_data,int *ref_categ_data,bool ref_is_col_major,size_t ref_ld_numeric
            ,size_t ref_ld_categ,double *ref_Xc,int *ref_Xc_ind,int *ref_Xc_indptr,
            uint64_t random_seed,bool use_long_double)

{
  int iVar1;
  
  if (use_long_double) {
    iVar1 = add_tree_internal<double,int,long_double>
                      (model_outputs,model_outputs_ext,numeric_data,ncols_numeric,categ_data,
                       ncols_categ,ncat,Xc,Xc_ind,Xc_indptr,ndim,ntry,coef_type,coef_by_prop,
                       sample_weights,nrows,max_depth,ncols_per_tree,limit_depth,penalize_range,
                       standardize_data,fast_bratio,col_weights,weigh_by_kurt,prob_pick_by_gain_pl,
                       prob_pick_by_gain_avg,prob_pick_by_full_gain,prob_pick_by_dens,
                       prob_pick_col_by_range,prob_pick_col_by_var,prob_pick_col_by_kurt,min_gain,
                       missing_action,cat_split_type,new_cat_action,depth_imp,weigh_imp_rows,
                       all_perm,imputer,min_imp_obs,indexer,ref_numeric_data,ref_categ_data,
                       ref_is_col_major,ref_ld_numeric,ref_ld_categ,ref_Xc,ref_Xc_ind,ref_Xc_indptr,
                       random_seed);
    return iVar1;
  }
  iVar1 = add_tree_internal<double,int,double>
                    (model_outputs,model_outputs_ext,numeric_data,ncols_numeric,categ_data,
                     ncols_categ,ncat,Xc,Xc_ind,Xc_indptr,ndim,ntry,coef_type,coef_by_prop,
                     sample_weights,nrows,max_depth,ncols_per_tree,limit_depth,penalize_range,
                     standardize_data,fast_bratio,col_weights,weigh_by_kurt,prob_pick_by_gain_pl,
                     prob_pick_by_gain_avg,prob_pick_by_full_gain,prob_pick_by_dens,
                     prob_pick_col_by_range,prob_pick_col_by_var,prob_pick_col_by_kurt,min_gain,
                     missing_action,cat_split_type,new_cat_action,depth_imp,weigh_imp_rows,all_perm,
                     imputer,min_imp_obs,indexer,ref_numeric_data,ref_categ_data,ref_is_col_major,
                     ref_ld_numeric,ref_ld_categ,ref_Xc,ref_Xc_ind,ref_Xc_indptr,random_seed);
  return iVar1;
}

Assistant:

ISOTREE_EXPORTED int add_tree(IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
             real_t numeric_data[],  size_t ncols_numeric,
             int    categ_data[],    size_t ncols_categ,    int ncat[],
             real_t Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
             size_t ndim, size_t ntry, CoefType coef_type, bool coef_by_prop,
             real_t sample_weights[], size_t nrows,
             size_t max_depth,     size_t ncols_per_tree,
             bool   limit_depth,   bool penalize_range, bool standardize_data,
             bool   fast_bratio,
             real_t col_weights[], bool weigh_by_kurt,
             double prob_pick_by_gain_pl, double prob_pick_by_gain_avg,
             double prob_pick_by_full_gain, double prob_pick_by_dens,
             double prob_pick_col_by_range, double prob_pick_col_by_var,
             double prob_pick_col_by_kurt,
             double min_gain, MissingAction missing_action,
             CategSplit cat_split_type, NewCategAction new_cat_action,
             UseDepthImp depth_imp, WeighImpRows weigh_imp_rows,
             bool   all_perm, Imputer *imputer, size_t min_imp_obs,
             TreesIndexer *indexer,
             real_t ref_numeric_data[], int ref_categ_data[],
             bool ref_is_col_major, size_t ref_ld_numeric, size_t ref_ld_categ,
             real_t ref_Xc[], sparse_ix ref_Xc_ind[], sparse_ix ref_Xc_indptr[],
             uint64_t random_seed, bool use_long_double)
{
    return add_tree<real_t, sparse_ix>
            (model_outputs, model_outputs_ext,
             numeric_data,  ncols_numeric,
             categ_data,    ncols_categ,    ncat,
             Xc, Xc_ind, Xc_indptr,
             ndim, ntry, coef_type, coef_by_prop,
             sample_weights, nrows,
             max_depth,     ncols_per_tree,
             limit_depth,   penalize_range, standardize_data,
             fast_bratio,
             col_weights, weigh_by_kurt,
             prob_pick_by_gain_pl, prob_pick_by_gain_avg,
             prob_pick_by_full_gain, prob_pick_by_dens,
             prob_pick_col_by_range, prob_pick_col_by_var,
             prob_pick_col_by_kurt,
             min_gain, missing_action,
             cat_split_type, new_cat_action,
             depth_imp, weigh_imp_rows,
             all_perm, imputer, min_imp_obs,
             indexer,
             ref_numeric_data, ref_categ_data,
             ref_is_col_major, ref_ld_numeric, ref_ld_categ,
             ref_Xc, ref_Xc_ind, ref_Xc_indptr,
             random_seed, use_long_double);
}